

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flute_mst.c
# Opt level: O0

Tree smergetree(Tree t1,Tree t2,int *o1,int *o2,int cx,int cy)

{
  int iVar1;
  Tree t_00;
  Tree TVar2;
  int iVar3;
  int iVar4;
  Branch *pBVar5;
  Branch *pBVar6;
  Branch *__ptr;
  Branch *pBVar7;
  Branch *__ptr_00;
  bool local_1fb9;
  int map [1000];
  int o [1000];
  int offset;
  int next;
  int curr;
  int prev;
  int mapped_cn;
  int cn;
  int ci;
  int n;
  int k;
  int j;
  int i;
  int d;
  int *o2_local;
  int *o1_local;
  Tree t2_local;
  Tree t1_local;
  Tree t;
  
  __ptr = t2.branch;
  __ptr_00 = t1.branch;
  t2_local.branch._0_4_ = t1.deg;
  o1_local._0_4_ = t2.deg;
  iVar3 = (int)t2_local.branch + (int)o1_local + -1;
  pBVar5 = (Branch *)malloc((long)(iVar3 * 2 + -2) * 0xc);
  iVar4 = (int)o1_local + -1;
  j = (int)t2_local.branch * 2 + -2;
  k = 0;
  while ((k < (int)t2_local.branch && ((__ptr_00[k].x != cx || (__ptr_00[k].y != cy))))) {
    k = k + 1;
  }
  curr = __ptr_00[k].n;
  if ((__ptr_00[curr].x != cx) || (__ptr_00[curr].y != cy)) {
    pBVar6 = pBVar5 + (j + iVar4);
    pBVar7 = __ptr_00 + k;
    iVar1 = pBVar7->y;
    pBVar6->x = pBVar7->x;
    pBVar6->y = iVar1;
    pBVar6->n = pBVar7->n;
    pBVar5[j + iVar4].n = iVar4 + pBVar5[j + iVar4].n;
    __ptr_00[k].n = j;
    curr = j;
    j = (int)t2_local.branch * 2 + -1;
  }
  for (k = (int)o1_local; k < (int)o1_local * 2 + -2; k = k + 1) {
    map[(long)k + -2] = -1;
  }
  k = 0;
  do {
    if ((int)o1_local <= k) {
LAB_0015c9a5:
      iVar1 = __ptr[k].n;
      if ((__ptr[iVar1].x != cx) || (prev = iVar1, __ptr[iVar1].y != cy)) {
        prev = k;
      }
      offset = __ptr[iVar1].n;
      next = iVar1;
      for (o[999] = __ptr[offset].n; offset != o[999]; o[999] = __ptr[o[999]].n) {
        __ptr[offset].n = next;
        next = offset;
        offset = o[999];
      }
      __ptr[offset].n = next;
      __ptr[iVar1].n = prev;
      for (k = (int)o1_local; k < (int)o1_local * 2 + -2; k = k + 1) {
        if (k != prev) {
          map[(long)k + -2] = j;
          j = j + 1;
        }
      }
      map[(long)prev + -2] = curr;
      k = 0;
      n = 0;
      ci = (int)(mapped_cn == 0);
      do {
        if (ci < (int)o1_local) {
          if (k < (int)t2_local.branch) {
            if (o1[k] < o2[ci]) {
              pBVar6 = pBVar5 + n;
              pBVar7 = __ptr_00 + k;
              iVar1 = pBVar7->y;
              pBVar6->x = pBVar7->x;
              pBVar6->y = iVar1;
              pBVar6->n = pBVar7->n;
              pBVar5[n].n = __ptr_00[k].n + iVar4;
              map[(long)n + 0x3e6] = o1[k];
              k = k + 1;
              iVar1 = ci;
            }
            else {
              pBVar6 = pBVar5 + n;
              pBVar7 = __ptr + ci;
              iVar1 = pBVar7->y;
              pBVar6->x = pBVar7->x;
              pBVar6->y = iVar1;
              pBVar6->n = pBVar7->n;
              pBVar5[n].n = map[(long)__ptr[ci].n + -2] + iVar4;
              map[(long)n + 0x3e6] = o2[ci];
              iVar1 = ci + 1;
              if (ci + 1 == mapped_cn) {
                iVar1 = ci + 2;
              }
            }
            ci = iVar1;
            n = n + 1;
          }
          else {
            for (; ci < (int)o1_local; ci = ci + 1) {
              if (ci != mapped_cn) {
                pBVar6 = pBVar5 + n;
                pBVar7 = __ptr + ci;
                iVar1 = pBVar7->y;
                pBVar6->x = pBVar7->x;
                pBVar6->y = iVar1;
                pBVar6->n = pBVar7->n;
                pBVar5[n].n = map[(long)__ptr[ci].n + -2] + iVar4;
                map[(long)n + 0x3e6] = o2[ci];
                n = n + 1;
              }
            }
          }
        }
        else {
          for (; k < (int)t2_local.branch; k = k + 1) {
            pBVar6 = pBVar5 + n;
            pBVar7 = __ptr_00 + k;
            iVar1 = pBVar7->y;
            pBVar6->x = pBVar7->x;
            pBVar6->y = iVar1;
            pBVar6->n = pBVar7->n;
            pBVar5[n].n = __ptr_00[k].n + iVar4;
            map[(long)n + 0x3e6] = o1[k];
            n = n + 1;
          }
        }
        local_1fb9 = k < (int)t2_local.branch || ci < (int)o1_local;
      } while (local_1fb9);
      for (k = 0; k < n; k = k + 1) {
        o1[k] = map[(long)k + 0x3e6];
      }
      for (k = (int)t2_local.branch; k < (int)t2_local.branch * 2 + -2; k = k + 1) {
        pBVar6 = pBVar5 + (k + iVar4);
        pBVar7 = __ptr_00 + k;
        iVar1 = pBVar7->y;
        pBVar6->x = pBVar7->x;
        pBVar6->y = iVar1;
        pBVar6->n = pBVar7->n;
        pBVar5[k + iVar4].n = __ptr_00[k].n + iVar4;
      }
      for (k = (int)o1_local; k < (int)o1_local * 2 + -2; k = k + 1) {
        if (k != prev) {
          pBVar6 = pBVar5 + (map[(long)k + -2] + iVar4);
          pBVar7 = __ptr + k;
          iVar1 = pBVar7->y;
          pBVar6->x = pBVar7->x;
          pBVar6->y = iVar1;
          pBVar6->n = pBVar7->n;
          pBVar5[map[(long)k + -2] + iVar4].n = map[(long)__ptr[k].n + -2] + iVar4;
        }
      }
      for (k = j + iVar4; k < iVar3 * 2 + -2; k = k + 1) {
        pBVar6 = pBVar5 + k;
        iVar4 = __ptr->y;
        pBVar6->x = __ptr->x;
        pBVar6->y = iVar4;
        pBVar6->n = __ptr->n;
        pBVar5[k].n = k;
      }
      free(__ptr_00);
      free(__ptr);
      t_00.length = t1_local.branch._4_4_;
      t_00.deg = iVar3;
      t_00.branch = pBVar5;
      iVar4 = wirelength(t_00);
      TVar2.length = iVar4;
      TVar2.deg = iVar3;
      TVar2.branch = pBVar5;
      return TVar2;
    }
    if ((__ptr[k].x == cx) && (__ptr[k].y == cy)) {
      mapped_cn = k;
      goto LAB_0015c9a5;
    }
    k = k + 1;
  } while( true );
}

Assistant:

Tree smergetree(Tree t1, Tree t2, int *o1, int *o2,
		DTYPE cx, DTYPE cy)
{
  Tree t;
  int d, i, j, k, n, ci, cn, mapped_cn, prev, curr, next, offset;
#if MR_FOR_SMALL_CASES_ONLY
  int o[D2M+MAXPART], map[2*D2M];
#else
  int *o, *map;

  map = (int*)malloc(sizeof(int)*(t1.deg+t2.deg)*2);
  o = (int*)malloc(sizeof(int)*(t1.deg+t2.deg+MAXPART2));  
#endif

  t.deg = t1.deg + t2.deg - 1;
  t.branch = (Branch *) malloc((2*t.deg-2)*sizeof(Branch));

  offset = t2.deg - 1;
  d = t1.deg*2-2;

  for (i=0; i<t1.deg; i++) {
    if (t1.branch[i].x==cx && t1.branch[i].y==cy) {
      break;
    }
  }
  n = t1.branch[i].n;
  if (t1.branch[n].x==cx && t1.branch[n].y==cy) {
    mapped_cn = n;
  } else {
    t.branch[d+offset] = t1.branch[i];
    t.branch[d+offset].n += offset;
    t1.branch[i].n = d;
    mapped_cn = d;
    d++;
  }

  for (i=t2.deg; i<t2.deg*2-2; i++) {
    map[i] = -1;
  }
  for (i=0; i<t2.deg; i++) {
    if (t2.branch[i].x==cx && t2.branch[i].y==cy) {
      ci = i;
      break;
    }
  }

  n = t2.branch[i].n;

  if (t2.branch[n].x==cx && t2.branch[n].y==cy) {
    cn = n;
  } else {
    cn = i;
  }

  prev = n;
  curr = t2.branch[n].n;
  next = t2.branch[curr].n;
  while (curr != next) {
    t2.branch[curr].n = prev;
    prev = curr;
    curr = next;
    next = t2.branch[curr].n;
  }
  t2.branch[curr].n = prev;
  t2.branch[n].n = cn;

  for (i=t2.deg; i<2*t2.deg-2; i++) {
    if (i!=cn) {
      map[i] = d++;
    }
  }
  map[cn] = mapped_cn;

  /* merge the pin nodes in the correct order */
  j = i = k = 0;
  if (k==ci) { k++; }

  do {
    if (k>=t2.deg) {
      for (; i<t1.deg; i++) {
	t.branch[j] = t1.branch[i];
	t.branch[j].n = t1.branch[i].n + offset;
	o[j] = o1[i];
	j++;
      }
    } else if (i>=t1.deg) {
      for (; k<t2.deg; k++) {
	if (k==ci) {
	  continue;
	}
	t.branch[j] = t2.branch[k];
	n = t2.branch[k].n;
	t.branch[j].n = map[n] + offset;
	o[j] = o2[k];
	j++;
      }
    } else if (o1[i] < o2[k]) {
      t.branch[j] = t1.branch[i];
      t.branch[j].n = t1.branch[i].n + offset;
      o[j] = o1[i];
      j++;
      i++;
    } else {
      t.branch[j] = t2.branch[k];
      n = t2.branch[k].n;
      t.branch[j].n = map[n] + offset;
      o[j] = o2[k];
      j++;
      k++;
      if (k==ci) { k++; }
    }
  }while (i<t1.deg || k<t2.deg);
  //assert(j==t.deg);

  for (i=0; i<j; i++) {
    o1[i] = o[i];
  }

  for (i=t1.deg; i<t1.deg*2-2; i++) {
    t.branch[i+offset] = t1.branch[i];
    t.branch[i+offset].n = t1.branch[i].n + offset;
  }

  for (i=t2.deg; i<2*t2.deg-2; i++) {
    if (i != cn) {
      t.branch[map[i]+offset] = t2.branch[i];
      n = t2.branch[i].n;
      t.branch[map[i]+offset].n = map[n] + offset;
    }
  }

  for (i=d+offset; i<t.deg*2-2; i++) {
    t.branch[i] = t2.branch[0];
    t.branch[i].n = i;
  }

  free(t1.branch);
  free(t2.branch);

  t.length = wirelength(t);

#if !(MR_FOR_SMALL_CASES_ONLY)
  free(map); free(o);
#endif
  return t;
}